

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  double dVar1;
  float *output;
  int n;
  int k;
  int i;
  int comp_local;
  int y_local;
  int x_local;
  stbi_uc *data_local;
  
  data_local = (stbi_uc *)malloc((long)(x * y * comp) << 2);
  if (data_local == (stbi_uc *)0x0) {
    free(data);
    e("Out of memory");
    data_local = (stbi_uc *)0x0;
  }
  else {
    output._0_4_ = comp;
    if ((comp & 1U) == 0) {
      output._0_4_ = comp + -1;
    }
    for (n = 0; n < x * y; n = n + 1) {
      for (output._4_4_ = 0; output._4_4_ < (int)output; output._4_4_ = output._4_4_ + 1) {
        dVar1 = pow((double)((float)data[n * comp + output._4_4_] / 255.0),(double)l2h_gamma);
        *(float *)(data_local + (long)(n * comp + output._4_4_) * 4) = (float)dVar1 * l2h_scale;
      }
      if (output._4_4_ < comp) {
        *(float *)(data_local + (long)(n * comp + output._4_4_) * 4) =
             (float)data[n * comp + output._4_4_] / 255.0;
      }
    }
    free(data);
  }
  return (float *)data_local;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}